

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_close(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  square_conflict *psVar3;
  loc local_2c;
  loc_conflict grid1;
  wchar_t wStack_1c;
  _Bool more;
  wchar_t err;
  wchar_t dir;
  loc_conflict grid;
  command *cmd_local;
  
  grid1.x._3_1_ = 0;
  grid = (loc_conflict)cmd;
  grid1.y = cmd_get_arg_direction(cmd,"direction",&stack0xffffffffffffffe4);
  if ((grid1.y != L'\0') || (wStack_1c == L'\0')) {
    wVar2 = count_feats(&local_2c,square_isopendoor,false);
    if (wVar2 == L'\x01') {
      wStack_1c = motion_dir(player->grid,local_2c);
      cmd_set_arg_direction((command *)grid,"direction",wStack_1c);
    }
    else {
      wVar2 = cmd_get_direction((command *)grid,"direction",&stack0xffffffffffffffe4,false);
      if (wVar2 != L'\0') {
        return;
      }
    }
  }
  _err = (loc_conflict)loc_sum(player->grid,ddgrid[wStack_1c]);
  _Var1 = do_cmd_close_test(player,_err);
  if (_Var1) {
    player->upkeep->energy_use = (uint)z_info->move_energy;
    _Var1 = player_confuse_dir(player,&stack0xffffffffffffffe4,false);
    if (_Var1) {
      _err = (loc_conflict)loc_sum(player->grid,ddgrid[wStack_1c]);
    }
    psVar3 = square((chunk *)cave,_err);
    if (psVar3->mon < 1) {
      grid1.x._3_1_ = do_cmd_close_aux(_err);
    }
    else {
      msg("There is a monster in the way!");
      py_attack(player,_err);
    }
    if ((grid1.x._3_1_ & 1) == 0) {
      disturb(player);
    }
  }
  else {
    disturb(player);
  }
  return;
}

Assistant:

void do_cmd_close(struct command *cmd)
{
	struct loc grid;
	int dir;
	int err;

	bool more = false;

	/* Get arguments */
	err = cmd_get_arg_direction(cmd, "direction", &dir);
	if (err || dir == DIR_UNKNOWN) {
		struct loc grid1;

		/* Count open doors */
		if (count_feats(&grid1, square_isopendoor, false) == 1) {
			dir = motion_dir(player->grid, grid1);
			cmd_set_arg_direction(cmd, "direction", dir);
		} else if (cmd_get_direction(cmd, "direction", &dir, false)) {
			return;
		}
	}

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Verify legality */
	if (!do_cmd_close_test(player, grid)) {
		/* Cancel repeat */
		disturb(player);
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Monster - alert, then attack */
	if (square(cave, grid)->mon > 0) {
		msg("There is a monster in the way!");
		py_attack(player, grid);
	} else
		/* Door - close it */
		more = do_cmd_close_aux(grid);

	/* Cancel repeat unless told not to */
	if (!more) disturb(player);
}